

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

const_local_iterator * __thiscall
google::
sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::begin(const_local_iterator *__return_storage_ptr__,
       sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       *this,size_type i)

{
  Table *this_00;
  sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar2;
  const_nonempty_iterator ppVar3;
  bool bVar4;
  const_nonempty_iterator *__return_storage_ptr___00;
  const_nonempty_iterator *__return_storage_ptr___01;
  const_nonempty_iterator cStack_a8;
  const_nonempty_iterator local_88;
  const_nonempty_iterator local_68;
  const_nonempty_iterator local_48;
  
  __return_storage_ptr___01 = &cStack_a8;
  this_00 = &this->table;
  bVar4 = sparsetable<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
          ::test(this_00,i);
  if (bVar4) {
    __return_storage_ptr___00 = &local_48;
    sparsetable<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
    ::get_iter(__return_storage_ptr___00,this_00,i);
    __return_storage_ptr___01 = &local_68;
  }
  else {
    __return_storage_ptr___00 = &local_88;
    sparsetable<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
    ::nonempty_end(__return_storage_ptr___00,this_00);
  }
  sparsetable<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
  ::nonempty_end(__return_storage_ptr___01,this_00);
  psVar1 = (__return_storage_ptr___01->row_begin)._M_current;
  psVar2 = (__return_storage_ptr___01->row_end)._M_current;
  ppVar3 = __return_storage_ptr___01->col_current;
  (__return_storage_ptr__->end).row_current._M_current =
       (__return_storage_ptr___01->row_current)._M_current;
  (__return_storage_ptr__->end).col_current = ppVar3;
  (__return_storage_ptr__->end).row_begin._M_current = psVar1;
  (__return_storage_ptr__->end).row_end._M_current = psVar2;
  psVar1 = (__return_storage_ptr___00->row_end)._M_current;
  psVar2 = (__return_storage_ptr___00->row_current)._M_current;
  ppVar3 = __return_storage_ptr___00->col_current;
  (__return_storage_ptr__->pos).row_begin._M_current =
       (__return_storage_ptr___00->row_begin)._M_current;
  (__return_storage_ptr__->pos).row_end._M_current = psVar1;
  (__return_storage_ptr__->pos).row_current._M_current = psVar2;
  (__return_storage_ptr__->pos).col_current = ppVar3;
  __return_storage_ptr__->ht = this;
  sparse_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const_local_iterator begin(size_type i) const {
    if (table.test(i))
      return const_local_iterator(this, table.get_iter(i),
                                  table.nonempty_end());
    else
      return const_local_iterator(this, table.nonempty_end(),
                                  table.nonempty_end());
  }